

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_attribute __thiscall
pugi::xml_node::insert_attribute_after(xml_node *this,char_t *name_,xml_attribute *attr)

{
  bool bVar1;
  xml_node_type parent;
  xml_allocator *this_00;
  xml_attribute_struct *attr_00;
  xml_attribute *in_RDX;
  xml_attribute *in_RSI;
  xml_node *in_RDI;
  xml_attribute a;
  xml_allocator *alloc;
  xml_attribute local_30;
  xml_attribute local_8;
  
  parent = type(in_RDI);
  bVar1 = impl::anon_unknown_0::allow_insert_attribute(parent);
  if (bVar1) {
    bVar1 = xml_attribute::operator!(in_RDX);
    if ((!bVar1) &&
       (bVar1 = impl::anon_unknown_0::is_attribute_of(in_RDX->_attr,in_RDI->_root), bVar1)) {
      this_00 = impl::anon_unknown_0::get_allocator<pugi::xml_node_struct>(in_RDI->_root);
      bVar1 = impl::anon_unknown_0::xml_allocator::reserve(this_00);
      if (!bVar1) {
        xml_attribute::xml_attribute(&local_8);
        return (xml_attribute)local_8._attr;
      }
      attr_00 = impl::anon_unknown_0::allocate_attribute(this_00);
      xml_attribute::xml_attribute(&local_30,attr_00);
      bVar1 = xml_attribute::operator!(&local_30);
      if (!bVar1) {
        impl::anon_unknown_0::insert_attribute_after(local_30._attr,in_RDX->_attr,in_RDI->_root);
        xml_attribute::set_name(in_RSI,(char_t *)in_RDX);
        return (xml_attribute)local_30._attr;
      }
      xml_attribute::xml_attribute(&local_8);
      return (xml_attribute)local_8._attr;
    }
    xml_attribute::xml_attribute(&local_8);
  }
  else {
    xml_attribute::xml_attribute(&local_8);
  }
  return (xml_attribute)local_8._attr;
}

Assistant:

PUGI_IMPL_FN xml_attribute xml_node::insert_attribute_after(const char_t* name_, const xml_attribute& attr)
	{
		if (!impl::allow_insert_attribute(type())) return xml_attribute();
		if (!attr || !impl::is_attribute_of(attr._attr, _root)) return xml_attribute();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_attribute();

		xml_attribute a(impl::allocate_attribute(alloc));
		if (!a) return xml_attribute();

		impl::insert_attribute_after(a._attr, attr._attr, _root);

		a.set_name(name_);

		return a;
	}